

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_outer_tcp.c
# Opt level: O2

int incoming_parse_cmd_data(asterism_tcp_incoming_s *incoming,uv_buf_t *buf,int *eaten)

{
  long lVar1;
  char cVar2;
  asterism_stream_s *paVar3;
  connect_ack_cb p_Var4;
  ushort uVar5;
  int iVar6;
  uv_write_t *req;
  char *pcVar7;
  asterism_session_s *paVar8;
  asterism_handshake_s *elm;
  asterism_trans_proto_s *base;
  char *pcVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  uv_buf_t uVar14;
  uv_buf_t __buf;
  
  if (3 < buf->len) {
    pcVar9 = buf->base;
    if (*pcVar9 != '\x10') {
      return -1;
    }
    uVar10 = *(ushort *)(pcVar9 + 2) << 8 | *(ushort *)(pcVar9 + 2) >> 8;
    if (0x1000 < uVar10) {
      return -1;
    }
    if ((ulong)uVar10 <= buf->len) {
      cVar2 = pcVar9[1];
      if (cVar2 == '\x04') {
        base = (asterism_trans_proto_s *)malloc(4);
        *base = _global_proto_pong;
        req = (uv_write_t *)calloc(1,0xd0);
        uVar14 = uv_buf_init((char *)base,4);
        *(uv_buf_t *)(req + 1) = uVar14;
        req->data = incoming;
        iVar6 = asterism_stream_write
                          (req,(asterism_stream_s *)incoming,(uv_buf_t *)(req + 1),write_cmd_pong_cb
                          );
        if (iVar6 != 0) {
LAB_0010d730:
          free(req);
          return -1;
        }
      }
      else if (cVar2 == '\x03') {
        _asterism_log(ASTERISM_LOG_DEBUG,
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_outer_tcp.c(175)"
                      ,"connection connect ack recv");
        if ((ushort)(*(ushort *)(pcVar9 + 2) << 8 | *(ushort *)(pcVar9 + 2) >> 8) < 8) {
          return -1;
        }
        uVar13 = *(uint *)(pcVar9 + 4);
        cVar2 = pcVar9[8];
        __buf.len = 0;
        __buf.base = (char *)(ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 |
                                     (uVar13 & 0xff00) << 8 | uVar13 << 0x18);
        elm = asterism_handshake_tree_s_RB_FIND
                        (&incoming->as->handshake_set,(asterism_handshake_s *)&__buf);
        if (elm == (asterism_handshake_s *)0x0) {
          return -1;
        }
        asterism_handshake_tree_s_RB_REMOVE(&incoming->as->handshake_set,elm);
        paVar3 = elm->inner;
        incoming->link = paVar3;
        paVar3->link = (asterism_stream_s *)incoming;
        p_Var4 = elm->conn_ack_cb;
        free(elm);
        iVar6 = (*p_Var4)(incoming->link,(int)cVar2);
        if (iVar6 != 0) {
          return -1;
        }
      }
      else {
        if (cVar2 != '\x01') {
          return -1;
        }
        _asterism_log(ASTERISM_LOG_DEBUG,
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_outer_tcp.c(169)"
                      ,"connection join recv");
        uVar5 = *(ushort *)(pcVar9 + 2) << 8 | *(ushort *)(pcVar9 + 2) >> 8;
        if (uVar5 < 6) {
          return -1;
        }
        uVar11 = *(ushort *)(pcVar9 + 4) << 8 | *(ushort *)(pcVar9 + 4) >> 8;
        lVar1 = (ulong)uVar11 + 6;
        if ((uint)uVar5 < (uint)lVar1) {
          return -1;
        }
        uVar13 = uVar11 + 8;
        if (uVar5 < uVar13) {
          return -1;
        }
        uVar12 = *(ushort *)(pcVar9 + lVar1) << 8 | *(ushort *)(pcVar9 + lVar1) >> 8;
        if ((uint)uVar5 < uVar13 + uVar12) {
          return -1;
        }
        req = (uv_write_t *)calloc(1,0x38);
        pcVar7 = as_strdup2(pcVar9 + 6,(ulong)uVar11);
        req->data = pcVar7;
        paVar8 = asterism_session_tree_s_RB_FIND(&incoming->as->sessions,(asterism_session_s *)req);
        if (paVar8 != (asterism_session_s *)0x0) {
          free(req->data);
          goto LAB_0010d730;
        }
        pcVar9 = as_strdup2(pcVar9 + uVar13,(ulong)uVar12);
        *(char **)&req->type = pcVar9;
        req->active_queue[0] = incoming;
        incoming->session = (asterism_session_s *)req;
        asterism_session_tree_s_RB_INSERT(&incoming->as->sessions,(asterism_session_s *)req);
        _asterism_log(ASTERISM_LOG_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_outer_tcp.c(87)"
                      ,"user: %s join, pass: %s",req->data,*(char **)&req->type);
      }
      *eaten = *eaten + (uint)uVar10;
      uVar13 = (int)buf->len - (uint)uVar10;
      __buf.len = (size_t)uVar13;
      if (uVar13 == 0) {
        return 0;
      }
      __buf.base = buf->base + uVar10;
      iVar6 = incoming_parse_cmd_data(incoming,&__buf,eaten);
      return iVar6;
    }
  }
  return 0;
}

Assistant:

static int incoming_parse_cmd_data(
    struct asterism_tcp_incoming_s *incoming,
    uv_buf_t *buf,
    int *eaten)
{
    if (buf->len < sizeof(struct asterism_trans_proto_s))
        return 0;
    struct asterism_trans_proto_s *proto = (struct asterism_trans_proto_s *)buf->base;
    uint16_t proto_len = ntohs(proto->len);
    if (proto->version != ASTERISM_TRANS_PROTO_VERSION)
        return -1;
    if (proto_len > ASTERISM_MAX_PROTO_SIZE)
        return -1;
    if (proto_len > buf->len)
    {
        return 0;
    }
    if (proto->cmd == ASTERISM_TRANS_PROTO_JOIN)
    {
        asterism_log(ASTERISM_LOG_DEBUG, "connection join recv");
        if (parse_cmd_join(incoming, proto) != 0)
            return -1;
    }
    else if (proto->cmd == ASTERISM_TRANS_PROTO_CONNECT_ACK)
    {
        asterism_log(ASTERISM_LOG_DEBUG, "connection connect ack recv");
        if (parse_cmd_connect_ack(incoming, proto) != 0)
            return -1;
    }
    else if (proto->cmd == ASTERISM_TRANS_PROTO_PING)
    {
        //asterism_log(ASTERISM_LOG_DEBUG, "connection ping recv");
        if (parse_cmd_ping(incoming, proto) != 0)
            return -1;
    }
    else
    {
        return -1;
    }
    *eaten += proto_len;
    unsigned int remain = buf->len - proto_len;
    if (remain)
    {
        uv_buf_t __buf;
        __buf.base = buf->base + proto_len;
        __buf.len = remain;
        return incoming_parse_cmd_data(incoming, &__buf, eaten);
    }
    return 0;
}